

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O1

void __thiscall
Js::StackScriptFunction::BoxState::BoxState
          (BoxState *this,ArenaAllocator *alloc,FunctionBody *functionBody,
          ScriptContext *scriptContext,void *returnAddress)

{
  NestedArray *pNVar1;
  code *pcVar2;
  FunctionBody *this_00;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  FunctionInfo *this_01;
  uint i;
  uint index;
  FunctionBody *local_58;
  BoxState *local_50;
  FunctionBody *local_48;
  FunctionProxy *nested;
  FunctionBody *current;
  
  current = (FunctionBody *)returnAddress;
  JsUtil::
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)this,alloc,0);
  local_50 = this;
  JsUtil::
  BaseDictionary<Js::FunctionProxy_*,_Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&(this->functionObjectToBox).
                    super_BaseDictionary<Js::FunctionProxy_*,_Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ,alloc,0);
  JsUtil::
  BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->boxedValues,alloc,0);
  this->scriptContext = scriptContext;
  this->returnAddress = current;
  if (((((functionBody->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) == Flags_None)
      || (pNVar1 = (functionBody->super_ParseableFunctionInfo).nestedArray.ptr,
         pNVar1 == (NestedArray *)0x0)) || (pNVar1->nestedCount == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x70,
                                "(functionBody->DoStackNestedFunc() && functionBody->GetNestedCount() != 0)"
                                ,
                                "functionBody->DoStackNestedFunc() && functionBody->GetNestedCount() != 0"
                               );
    if (!bVar3) {
LAB_00d5fa27:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  nested = (FunctionProxy *)functionBody;
  current = (FunctionBody *)__tls_get_addr(&PTR_0155fe48);
  do {
    local_58 = (FunctionBody *)nested;
    JsUtil::
    BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                *)local_50,&local_58,(FunctionBody **)&nested);
    index = 0;
    while( true ) {
      uVar4 = 0;
      if (nested[2].m_scriptContext != (Type)0x0) {
        uVar4 = *(uint *)&((nested[2].m_scriptContext)->super_ScriptContextInfo).
                          _vptr_ScriptContextInfo;
      }
      if (uVar4 <= index) break;
      local_58 = (FunctionBody *)
                 ParseableFunctionInfo::GetNestedFunctionProxy
                           ((ParseableFunctionInfo *)nested,index);
      local_48 = local_58;
      JsUtil::
      BaseDictionary<Js::FunctionProxy*,Js::FunctionProxy*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<Js::FunctionProxy*,Js::FunctionProxy*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<Js::FunctionProxy*,Js::FunctionProxy*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                  *)&this->functionObjectToBox,(FunctionProxy **)&local_58,
                 (FunctionProxy **)&local_48);
      bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)local_48);
      this_00 = local_48;
      if (bVar3) {
        bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)local_48);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)
           &(current->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
          if (!bVar3) goto LAB_00d5fa27;
          *(undefined4 *)
           &(current->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
        }
        FunctionBody::ClearStackNestedFuncParent(this_00);
      }
      index = index + 1;
    }
    this_01 = FunctionBody::GetAndClearStackNestedFuncParent((FunctionBody *)nested);
    if (this_01 == (FunctionInfo *)0x0) {
      nested = (FunctionProxy *)0x0;
    }
    else {
      nested = (FunctionProxy *)FunctionInfo::GetFunctionBody(this_01);
    }
    if (((FunctionBody *)nested == (FunctionBody *)0x0) ||
       (((((FunctionBody *)nested)->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) ==
        Flags_None)) {
      return;
    }
  } while( true );
}

Assistant:

StackScriptFunction::BoxState::BoxState(ArenaAllocator * alloc, FunctionBody * functionBody, ScriptContext * scriptContext, void * returnAddress) :
        frameToBox(alloc), functionObjectToBox(alloc), boxedValues(alloc), scriptContext(scriptContext), returnAddress(returnAddress)
    {
        Assert(functionBody->DoStackNestedFunc() && functionBody->GetNestedCount() != 0);
        FunctionBody * current = functionBody;
        do
        {
            frameToBox.Add(current);

            for (uint i = 0; i < current->GetNestedCount(); i++)
            {
                FunctionProxy * nested = current->GetNestedFunctionProxy(i);
                functionObjectToBox.Add(nested);
                if (nested->IsFunctionBody())
                {
                    nested->GetFunctionBody()->ClearStackNestedFuncParent();
                }
            }
            FunctionInfo * functionInfo = current->GetAndClearStackNestedFuncParent();
            current = functionInfo ? functionInfo->GetFunctionBody() : nullptr;
        }
        while (current && current->DoStackNestedFunc());
    }